

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall el::Logger::flush(Logger *this,Level level,fstream_t *fs)

{
  TypedConfigurations *pTVar1;
  Level level_00;
  bool bVar2;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *psVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  Level local_24;
  
  local_24 = level;
  if (fs == (fstream_t *)0x0) {
    pTVar1 = this->m_typedConfigurations;
    (*(pTVar1->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar1);
    bVar2 = base::TypedConfigurations::unsafeGetConfigByVal<bool>
                      (pTVar1,level,&pTVar1->m_toFileMap,"toFile");
    level_00 = local_24;
    if (bVar2) {
      pTVar1 = this->m_typedConfigurations;
      (*(pTVar1->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar1);
      psVar3 = base::TypedConfigurations::unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
                         (pTVar1,level_00,&pTVar1->m_fileStreamMap,"fileStream");
      fs = (psVar3->
           super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
    }
    else {
      fs = (element_type *)0x0;
    }
  }
  if (fs != (element_type *)0x0) {
    std::ostream::flush();
    p_Var5 = (_Hash_node_base *)0x0;
    p_Var4 = base::utils::std::
             _Hashtable<el::Level,_std::pair<const_el::Level,_unsigned_int>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->m_unflushedCount)._M_h,
                        (ulong)local_24 % (this->m_unflushedCount)._M_h._M_bucket_count,&local_24,
                        (ulong)local_24);
    if (p_Var4 != (__node_base_ptr)0x0) {
      p_Var5 = p_Var4->_M_nxt;
    }
    if (p_Var5 != (_Hash_node_base *)0x0) {
      *(undefined4 *)((long)&p_Var5[1]._M_nxt + 4) = 0;
    }
  }
  return;
}

Assistant:

void Logger::flush(Level level, base::type::fstream_t* fs) {
  if (fs == nullptr && m_typedConfigurations->toFile(level)) {
    fs = m_typedConfigurations->fileStream(level);
  }
  if (fs != nullptr) {
    fs->flush();
    std::unordered_map<Level, unsigned int>::iterator iter = m_unflushedCount.find(level);
    if (iter != m_unflushedCount.end()) {
      iter->second = 0;
    }
  }
}